

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

int Prs_ManReadArguments(Prs_Man_t *p)

{
  Vec_Int_t *p_00;
  Prs_Ntk_t *pPVar1;
  int iVar2;
  int iVar3;
  int local_64;
  int local_60;
  int fSigned;
  int iName;
  int fEscape;
  Vec_Int_t *vSigsR [3];
  Vec_Int_t *vSigs [3];
  int iType;
  int iRange;
  Prs_Man_t *p_local;
  
  vSigs[2]._4_4_ = 0;
  vSigs[2]._0_4_ = -1;
  vSigs[0] = &p->pNtk->vOutputs;
  vSigs[1] = &p->pNtk->vInouts;
  _iName = &p->pNtk->vInputsR;
  vSigsR[0] = &p->pNtk->vOutputsR;
  vSigsR[1] = &p->pNtk->vInoutsR;
  iVar2 = Prs_ManIsChar(p,'(');
  if (iVar2 == 0) {
    __assert_fail("Prs_ManIsChar(p, \'(\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                  ,0x477,"int Prs_ManReadArguments(Prs_Man_t *)");
  }
  p->pCur = p->pCur + 1;
  iVar2 = Prs_ManUtilSkipSpaces(p);
  if (iVar2 == 0) {
    iVar2 = Prs_ManIsChar(p,')');
    if (iVar2 == 0) {
      do {
        iVar2 = Prs_ManIsChar(p,'\\');
        local_60 = Prs_ManReadName(p);
        local_64 = 0;
        if (local_60 == 0) {
          iVar2 = Prs_ManErrorSet(p,"Error number 31.",0);
          return iVar2;
        }
        iVar3 = Prs_ManUtilSkipSpaces(p);
        if (iVar3 != 0) {
          iVar2 = Prs_ManErrorSet(p,"Error number 32.",0);
          return iVar2;
        }
        if (((0 < local_60) && (local_60 < 4)) && (iVar2 == 0)) {
          vSigs[2]._0_4_ = local_60;
          iVar2 = Prs_ManIsChar(p,'[');
          if (iVar2 != 0) {
            vSigs[2]._4_4_ = Prs_ManReadRange(p);
            if (vSigs[2]._4_4_ == 0) {
              iVar2 = Prs_ManErrorSet(p,"Error number 33.",0);
              return iVar2;
            }
            iVar2 = Prs_ManUtilSkipSpaces(p);
            if (iVar2 != 0) {
              iVar2 = Prs_ManErrorSet(p,"Error number 34.",0);
              return iVar2;
            }
          }
          local_60 = Prs_ManReadName(p);
          if (local_60 == 0) {
            iVar2 = Prs_ManErrorSet(p,"Error number 35.",0);
            return iVar2;
          }
          if (local_60 == 0xf) {
            local_64 = 1;
            iVar2 = Prs_ManUtilSkipSpaces(p);
            if (iVar2 != 0) {
              iVar2 = Prs_ManErrorSet(p,"Error number 32.",0);
              return iVar2;
            }
            iVar2 = Prs_ManIsChar(p,'[');
            if (iVar2 != 0) {
              vSigs[2]._4_4_ = Prs_ManReadRange(p);
              if (vSigs[2]._4_4_ == 0) {
                iVar2 = Prs_ManErrorSet(p,"Error number 33.",0);
                return iVar2;
              }
              iVar2 = Prs_ManUtilSkipSpaces(p);
              if (iVar2 != 0) {
                iVar2 = Prs_ManErrorSet(p,"Error number 34.",0);
                return iVar2;
              }
            }
            local_60 = Prs_ManReadName(p);
            if (local_60 == 0) {
              iVar2 = Prs_ManErrorSet(p,"Error number 35.",0);
              return iVar2;
            }
          }
        }
        if (0 < (int)vSigs[2]) {
          Vec_IntPush(vSigs[(long)((int)vSigs[2] + -1) + -1],local_60);
          p_00 = *(Vec_Int_t **)(&iName + (long)((int)vSigs[2] + -1) * 2);
          iVar2 = Abc_Var2Lit(vSigs[2]._4_4_,local_64);
          Vec_IntPush(p_00,iVar2);
          pPVar1 = p->pNtk;
          iVar2 = Abc_Var2Lit2(local_60,(int)vSigs[2]);
          Vec_IntPush(&pPVar1->vOrder,iVar2);
        }
        iVar2 = Prs_ManUtilSkipSpaces(p);
        if (iVar2 != 0) {
          iVar2 = Prs_ManErrorSet(p,"Error number 36.",0);
          return iVar2;
        }
        iVar2 = Prs_ManIsChar(p,')');
        if (iVar2 != 0) {
          iVar2 = Prs_ManIsChar(p,')');
          if (iVar2 != 0) {
            return 1;
          }
          __assert_fail("Prs_ManIsChar(p, \')\')",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                        ,0x4aa,"int Prs_ManReadArguments(Prs_Man_t *)");
        }
        iVar2 = Prs_ManIsChar(p,',');
        if (iVar2 == 0) {
          iVar2 = Prs_ManErrorSet(p,"Expecting comma in the instance.",0);
          return iVar2;
        }
        p->pCur = p->pCur + 1;
        iVar2 = Prs_ManUtilSkipSpaces(p);
      } while (iVar2 == 0);
      p_local._4_4_ = Prs_ManErrorSet(p,"Error number 36.",0);
    }
    else {
      p_local._4_4_ = 1;
    }
  }
  else {
    p_local._4_4_ = Prs_ManErrorSet(p,"Error number 30.",0);
  }
  return p_local._4_4_;
}

Assistant:

static inline int Prs_ManReadArguments( Prs_Man_t * p )
{
    int iRange = 0, iType = -1;
    Vec_Int_t * vSigs[3]  = { &p->pNtk->vInputs,  &p->pNtk->vOutputs,  &p->pNtk->vInouts  };
    Vec_Int_t * vSigsR[3] = { &p->pNtk->vInputsR, &p->pNtk->vOutputsR, &p->pNtk->vInoutsR };
    assert( Prs_ManIsChar(p, '(') );
    p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )             return Prs_ManErrorSet(p, "Error number 30.", 0);
    if ( Prs_ManIsChar(p, ')') )
        return 1;
    while ( 1 )
    {
        int fEscape = Prs_ManIsChar(p, '\\');
        int iName = Prs_ManReadName( p );
        int fSigned = 0;
        if ( iName == 0 )                       return Prs_ManErrorSet(p, "Error number 31.", 0);
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 32.", 0);
        if ( iName >= PRS_VER_INPUT && iName <= PRS_VER_INOUT && !fEscape ) // declaration
        {
            iType = iName;
            if ( Prs_ManIsChar(p, '[') )
            {
                iRange = Prs_ManReadRange(p);
                if ( iRange == 0 )              return Prs_ManErrorSet(p, "Error number 33.", 0);
                if ( Prs_ManUtilSkipSpaces(p) ) return Prs_ManErrorSet(p, "Error number 34.", 0);
            }
            iName = Prs_ManReadName( p );
            if ( iName == 0 )                   return Prs_ManErrorSet(p, "Error number 35.", 0);
            if ( iName == PRS_VER_SIGNED )
            {
                fSigned = 1;
                if ( Prs_ManUtilSkipSpaces(p) ) return Prs_ManErrorSet(p, "Error number 32.", 0);
                if ( Prs_ManIsChar(p, '[') )
                {
                    iRange = Prs_ManReadRange(p);
                    if ( iRange == 0 )              return Prs_ManErrorSet(p, "Error number 33.", 0);
                    if ( Prs_ManUtilSkipSpaces(p) ) return Prs_ManErrorSet(p, "Error number 34.", 0);
                }
                iName = Prs_ManReadName( p );
                if ( iName == 0 )               return Prs_ManErrorSet(p, "Error number 35.", 0);
            }
        }
        if ( iType > 0 )
        {
            Vec_IntPush( vSigs[iType - PRS_VER_INPUT], iName );
            Vec_IntPush( vSigsR[iType - PRS_VER_INPUT], Abc_Var2Lit(iRange, fSigned) );
            Vec_IntPush( &p->pNtk->vOrder, Abc_Var2Lit2(iName, iType) );
        }
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 36.", 0);
        if ( Prs_ManIsChar(p, ')') )
            break;
        if ( !Prs_ManIsChar(p, ',') )           return Prs_ManErrorSet(p, "Expecting comma in the instance.", 0);
        p->pCur++;
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 36.", 0);
    }
    // check final
    assert( Prs_ManIsChar(p, ')') );
    return 1;
}